

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_util.c
# Opt level: O1

void CMtransport_trace(CManager cm,char *format,...)

{
  FILE *__stream;
  char in_AL;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  timespec local_f8;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,CMTransportVerbose);
    if (iVar1 == 0) {
      return;
    }
  }
  else if (CMtrace_val[5] == 0) {
    return;
  }
  if (CMtrace_PID != 0) {
    __stream = (FILE *)cm->CMTrace_file;
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_f8);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_f8.tv_sec,local_f8.tv_nsec);
  }
  local_e8 = local_d8;
  local_f8.tv_nsec = (long)&ap[0].overflow_arg_area;
  local_f8.tv_sec = 0x3000000010;
  vfprintf((FILE *)cm->CMTrace_file,format,&local_f8);
  fputc(10,(FILE *)cm->CMTrace_file);
  return;
}

Assistant:

extern void
CMtransport_trace(CManager cm, const char *format, ...)
{
#ifndef MODULE
    va_list ap;
    if (CMtrace_on(cm, CMTransportVerbose)) {
        if (CMtrace_PID) {
            fprintf(cm->CMTrace_file, "P%lxT%lx - ", (long) getpid(), (long)thr_thread_self());
        }
        if (CMtrace_timing) {
            TRACE_TIME_DECL;
            TRACE_TIME_GET;
            fprintf(cm->CMTrace_file, TRACE_TIME_PRINTDETAILS);
        }
#ifdef STDC_HEADERS
	va_start(ap, format);
#else
	va_start(ap);
#endif
	vfprintf(cm->CMTrace_file, format, ap);
	va_end(ap);
	(void)cm;
	fprintf(cm->CMTrace_file, "\n");
    }
#endif
}